

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall FOptionMenuSliderBase::MouseEvent(FOptionMenuSliderBase *this,int type,int x,int y)

{
  DMenu *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  
  pDVar1 = DMenu::CurrentMenu;
  if (type != 0) {
    if (DMenu::CurrentMenu[1].super_DObject.Class != (PClass *)this) {
      return false;
    }
    if (type == 2) {
      DMenu::CurrentMenu[1].super_DObject.Class = (PClass *)0x0;
    }
  }
  iVar4 = CleanXfac_1 * 0x50 >> ((byte)this->mSliderShort & 0x1f);
  iVar5 = CleanXfac_1 * 8 + this->mDrawX;
  iVar3 = iVar5 + iVar4;
  if ((type != 0) || (x < iVar3 && iVar5 <= x)) {
    if (x < iVar3) {
      iVar3 = x;
    }
    iVar2 = 0;
    if (iVar5 < x) {
      iVar2 = iVar3 - iVar5;
    }
    dVar6 = ((this->mMax - this->mMin) * (double)iVar2) / (double)iVar4 + this->mMin;
    (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(this);
    if (dVar6 != extraout_XMM0_Qa) {
      (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x14])(dVar6,this);
    }
    if (type == 0) {
      pDVar1[1].super_DObject.Class = (PClass *)this;
    }
  }
  return true;
}

Assistant:

bool MouseEvent(int type, int x, int y)
	{
		DOptionMenu *lm = static_cast<DOptionMenu*>(DMenu::CurrentMenu);
		if (type != DMenu::MOUSE_Click)
		{
			if (!lm->CheckFocus(this)) return false;
		}
		if (type == DMenu::MOUSE_Release)
		{
			lm->ReleaseFocus();
		}

		int slide_left = mDrawX+8*CleanXfac_1;
		int slide_right = slide_left + (10*8*CleanXfac_1 >> mSliderShort);	// 12 char cells with 8 pixels each.

		if (type == DMenu::MOUSE_Click)
		{
			if (x < slide_left || x >= slide_right) return true;
		}

		x = clamp(x, slide_left, slide_right);
		double v = mMin + ((x - slide_left) * (mMax - mMin)) / (slide_right - slide_left);
		if (v != GetSliderValue())
		{
			SetSliderValue(v);
			//S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		}
		if (type == DMenu::MOUSE_Click)
		{
			lm->SetFocus(this);
		}
		return true;
	}